

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O1

sc_string_old __thiscall sc_dt::sc_string_old::operator+(sc_string_old *this,char *s)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  sc_string_rep *r;
  size_t sVar7;
  char *__dest;
  int iVar8;
  char *in_RDX;
  
  lVar1 = *(long *)s;
  sVar6 = strlen(*(char **)(lVar1 + 8));
  r = (sc_string_rep *)operator_new(0x10);
  sVar7 = strlen(in_RDX);
  iVar2 = (int)sVar6;
  uVar4 = (int)sVar7 + iVar2;
  uVar3 = (int)sVar7 + iVar2 + 0xf;
  if (-1 < (int)uVar4) {
    uVar3 = uVar4;
  }
  r->ref_count = 1;
  iVar8 = (uVar3 & 0xfffffff0) + 0x10;
  r->alloc = iVar8;
  iVar5 = -1;
  if (-1 < iVar8) {
    iVar5 = iVar8;
  }
  __dest = (char *)operator_new__((long)iVar5);
  r->str = __dest;
  *__dest = '\0';
  strcpy(__dest,*(char **)(lVar1 + 8));
  strcpy(__dest + iVar2,in_RDX);
  sc_string_old(this,r);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
sc_string_old::operator+( const char* s ) const
{
    int len = length();
    sc_string_rep* r = new sc_string_rep( len + strlen(s) + 1 );
    strcpy( r->str, rep->str );
    strcpy( r->str + len, s );
    return sc_string_old(r);
}